

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O3

void __thiscall xe::xml::Parser::parseEntityValue(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  undefined8 extraout_RAX;
  long lVar5;
  size_type *psVar6;
  Parser *this_00;
  string entity;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  
  paVar1 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::resize((ulong)&local_90,(char)(this->m_tokenizer).m_curTokenLen);
  if (0 < (this->m_tokenizer).m_curTokenLen) {
    lVar5 = 0;
    do {
      local_90._M_dataplus._M_p[lVar5] =
           (this->m_tokenizer).m_buf.m_buffer
           [((this->m_tokenizer).m_buf.m_back + (int)lVar5) % (this->m_tokenizer).m_buf.m_size];
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->m_tokenizer).m_curTokenLen);
  }
  lVar5 = 8;
  do {
    iVar3 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar3 == 0) {
      cVar2 = *(char *)((long)&getEntityValue(std::__cxx11::string_const&)::s_entities + lVar5);
      if (cVar2 != '\0') {
        std::__cxx11::string::resize((ulong)&this->m_entityValue,'\x01');
        *(this->m_entityValue)._M_dataplus._M_p = cVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        return;
      }
      break;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffb0,"Invalid entity \'",&local_90);
  this_00 = (Parser *)&stack0xffffffffffffffb0;
  plVar4 = (long *)std::__cxx11::string::append((char *)this_00);
  local_70._M_dataplus._M_p = (pointer)*plVar4;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar6) {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70.field_2._8_8_ = plVar4[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar6;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  error(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::parseEntityValue (void)
{
	DE_ASSERT(m_state == STATE_ENTITY && m_tokenizer.getToken() == TOKEN_ENTITY);

	std::string entity;
	m_tokenizer.getTokenStr(entity);

	const char value = getEntityValue(entity);
	if (value == 0)
		error("Invalid entity '" + entity + "'");

	m_entityValue.resize(1);
	m_entityValue[0] = value;
}